

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_curves.cpp
# Opt level: O2

void __thiscall
agg::curve3_div::recursive_bezier
          (curve3_div *this,double x1,double y1,double x2,double y2,double x3,double y3,uint level)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double y2_00;
  double x3_00;
  double y3_00;
  double dVar4;
  double dVar5;
  double dVar6;
  point_base<double> local_88;
  double local_78;
  double dStack_70;
  double local_68;
  double dStack_60;
  double local_58;
  double local_48;
  double dStack_40;
  double local_38;
  double dStack_30;
  double local_28;
  double dStack_20;
  
  local_38 = x3;
  dStack_30 = y3;
  do {
    if (0x20 < level) {
      return;
    }
    dVar3 = (x1 + x2) * 0.5;
    y2_00 = (y1 + y2) * 0.5;
    local_28 = (x2 + local_38) * 0.5;
    dStack_20 = (y2 + dStack_30) * 0.5;
    x3_00 = (dVar3 + local_28) * 0.5;
    y3_00 = (y2_00 + dStack_20) * 0.5;
    dVar1 = x3 - x1;
    dVar2 = y3 - y1;
    dVar5 = (x2 - x3) * dVar2 - (y2 - y3) * dVar1;
    if (ABS(dVar5) <= 1e-30) {
      dVar5 = dVar1 * dVar1 + dVar2 * dVar2;
      dVar6 = x2 - x1;
      dVar4 = y2 - y1;
      if ((dVar5 != 0.0) || (NAN(dVar5))) {
        dVar5 = (dVar6 * dVar1 + dVar4 * dVar2) / dVar5;
        if ((0.0 < dVar5) && (dVar5 < 1.0)) {
          return;
        }
        dVar6 = y1;
        dVar4 = x1;
        if ((dVar5 <= 0.0) || (dVar6 = y3, dVar4 = x3, 1.0 <= dVar5)) {
          dVar1 = (dVar4 - x2) * (dVar4 - x2) + (dVar6 - y2) * (dVar6 - y2);
        }
        else {
          dVar1 = (dVar1 * dVar5 + x1) - x2;
          dVar2 = (dVar2 * dVar5 + y1) - y2;
          dVar1 = dVar1 * dVar1 + dVar2 * dVar2;
        }
      }
      else {
        dVar1 = dVar6 * dVar6 + dVar4 * dVar4;
      }
      local_88.x = x2;
      local_88.y = y2;
      if (dVar1 < *(double *)(this + 8)) goto LAB_0011156f;
    }
    else if (dVar5 * dVar5 <= (dVar1 * dVar1 + dVar2 * dVar2) * *(double *)(this + 8)) {
      local_88.x = x3_00;
      local_88.y = y3_00;
      if (*(double *)(this + 0x10) <= 0.01 && *(double *)(this + 0x10) != 0.01) {
LAB_0011156f:
        pod_bvector<agg::point_base<double>,_6U>::add
                  ((pod_bvector<agg::point_base<double>,_6U> *)(this + 0x20),&local_88);
        return;
      }
      local_78 = y2;
      dStack_70 = y2;
      local_68 = x2;
      dStack_60 = y2;
      local_48 = dVar3;
      dStack_40 = y2_00;
      local_58 = atan2(y3 - y2,x3 - x2);
      dVar3 = atan2(local_78 - y1,local_68 - x1);
      dVar1 = ABS(local_58 - dVar3);
      dVar3 = local_48;
      y2_00 = dStack_40;
      if ((double)(~-(ulong)(dVar1 < 3.141592653589793) & (ulong)(6.283185307179586 - dVar1) |
                  (ulong)dVar1 & -(ulong)(dVar1 < 3.141592653589793)) < *(double *)(this + 0x10))
      goto LAB_0011156f;
    }
    level = level + 1;
    recursive_bezier(this,x1,y1,dVar3,y2_00,x3_00,y3_00,level);
    x1 = x3_00;
    y1 = y3_00;
    x2 = local_28;
    y2 = dStack_20;
  } while( true );
}

Assistant:

void curve3_div::recursive_bezier(double x1, double y1, 
                                      double x2, double y2, 
                                      double x3, double y3,
                                      unsigned level)
    {
        if(level > curve_recursion_limit) 
        {
            return;
        }

        // Calculate all the mid-points of the line segments
        //----------------------
        double x12   = (x1 + x2) / 2;                
        double y12   = (y1 + y2) / 2;
        double x23   = (x2 + x3) / 2;
        double y23   = (y2 + y3) / 2;
        double x123  = (x12 + x23) / 2;
        double y123  = (y12 + y23) / 2;

        double dx = x3-x1;
        double dy = y3-y1;
        double d = fabs(((x2 - x3) * dy - (y2 - y3) * dx));
        double da;

        if(d > curve_collinearity_epsilon)
        { 
            // Regular case
            //-----------------
            if(d * d <= m_distance_tolerance_square * (dx*dx + dy*dy))
            {
                // If the curvature doesn't exceed the distance_tolerance value
                // we tend to finish subdivisions.
                //----------------------
                if(m_angle_tolerance < curve_angle_tolerance_epsilon)
                {
                    m_points.add(point_d(x123, y123));
                    return;
                }

                // Angle & Cusp Condition
                //----------------------
                da = fabs(atan2(y3 - y2, x3 - x2) - atan2(y2 - y1, x2 - x1));
                if(da >= pi) da = 2*pi - da;

                if(da < m_angle_tolerance)
                {
                    // Finally we can stop the recursion
                    //----------------------
                    m_points.add(point_d(x123, y123));
                    return;                 
                }
            }
        }
        else
        {
            // Collinear case
            //------------------
            da = dx*dx + dy*dy;
            if(da == 0)
            {
                d = calc_sq_distance(x1, y1, x2, y2);
            }
            else
            {
                d = ((x2 - x1)*dx + (y2 - y1)*dy) / da;
                if(d > 0 && d < 1)
                {
                    // Simple collinear case, 1---2---3
                    // We can leave just two endpoints
                    return;
                }
                     if(d <= 0) d = calc_sq_distance(x2, y2, x1, y1);
                else if(d >= 1) d = calc_sq_distance(x2, y2, x3, y3);
                else            d = calc_sq_distance(x2, y2, x1 + d*dx, y1 + d*dy);
            }
            if(d < m_distance_tolerance_square)
            {
                m_points.add(point_d(x2, y2));
                return;
            }
        }

        // Continue subdivision
        //----------------------
        recursive_bezier(x1, y1, x12, y12, x123, y123, level + 1); 
        recursive_bezier(x123, y123, x23, y23, x3, y3, level + 1); 
    }